

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Cast_x86_avx512::forward(Cast_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint _c;
  int _elempack;
  int *piVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  unsigned_short uVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  _func_int *p_Var13;
  ulong uVar14;
  void *pvVar15;
  ulong uVar16;
  long lVar17;
  int i;
  int iVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  uint uVar23;
  int iVar24;
  undefined1 (*pauVar25) [16];
  undefined1 (*pauVar26) [64];
  undefined1 (*pauVar27) [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  float fVar30;
  undefined1 auVar31 [32];
  
  p_Var13 = this->_vptr_Cast_x86_avx512[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var13) == *(int *)(&this->field_0xd4 + (long)p_Var13)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar11 = bottom_blob->w;
    iVar24 = bottom_blob->h;
    iVar1 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar11;
    top_blob->h = iVar24;
    top_blob->d = iVar1;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar11 = bottom_blob->w;
  iVar24 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  _c = bottom_blob->c;
  iVar10 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar20 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var13)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var13) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx512 + (long)p_Var13),bottom_blob,
                    top_blob,opt);
    }
    sVar20 = sVar20 * 4;
    break;
  case 2:
  case 4:
    sVar20 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar20 = bottom_blob->elemsize;
  }
  switch(iVar10) {
  case 1:
    Mat::create(top_blob,iVar11,sVar20,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar11,iVar24,sVar20,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar11,iVar24,_c,sVar20,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar11,iVar24,iVar1,_c,sVar20,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 2)) {
    iVar10 = cpu_support_x86_avx512_fp16();
    if (iVar10 == 0) {
      iVar10 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar16 = 0;
      uVar14 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar14 = uVar16;
      }
      for (; uVar16 != uVar14; uVar16 = uVar16 + 1) {
        pvVar12 = bottom_blob->data;
        sVar20 = bottom_blob->elemsize;
        sVar4 = bottom_blob->cstep;
        pauVar27 = (undefined1 (*) [32])(sVar4 * uVar16 * sVar20 + (long)pvVar12);
        pvVar15 = top_blob->data;
        sVar5 = top_blob->elemsize;
        sVar6 = top_blob->cstep;
        pauVar22 = (undefined1 (*) [16])(sVar6 * uVar16 * sVar5 + (long)pvVar15);
        lVar17 = 0;
        for (iVar18 = 0; iVar18 + 7 < iVar10; iVar18 = iVar18 + 8) {
          auVar7 = vcvtps2ph_f16c(*pauVar27,3);
          *pauVar22 = auVar7;
          pauVar27 = pauVar27 + 1;
          pauVar22 = pauVar22 + 1;
          lVar17 = lVar17 + 8;
        }
        for (; iVar18 + 3 < iVar10; iVar18 = iVar18 + 4) {
          vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar27,3);
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
          lVar17 = lVar17 + 4;
        }
        for (; (int)lVar17 < iVar10; lVar17 = lVar17 + 1) {
          uVar9 = float32_to_float16(*(float *)((long)pvVar12 + lVar17 * 4 + sVar4 * sVar20 * uVar16
                                               ));
          *(unsigned_short *)((long)pvVar15 + lVar17 * 2 + sVar6 * sVar5 * uVar16) = uVar9;
        }
      }
    }
    else {
      cast_fp32_to_fp16_sse_avx512fp16(bottom_blob,top_blob,opt);
    }
  }
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 2) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) {
    iVar10 = cpu_support_x86_avx512_fp16();
    if (iVar10 == 0) {
      iVar10 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar16 = 0;
      uVar14 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar14 = uVar16;
      }
      for (; uVar16 != uVar14; uVar16 = uVar16 + 1) {
        pvVar12 = bottom_blob->data;
        sVar20 = bottom_blob->elemsize;
        sVar4 = bottom_blob->cstep;
        pauVar22 = (undefined1 (*) [16])(sVar4 * uVar16 * sVar20 + (long)pvVar12);
        pvVar15 = top_blob->data;
        sVar5 = top_blob->elemsize;
        sVar6 = top_blob->cstep;
        pauVar27 = (undefined1 (*) [32])(sVar6 * uVar16 * sVar5 + (long)pvVar15);
        lVar17 = 0;
        for (iVar18 = 0; iVar18 + 7 < iVar10; iVar18 = iVar18 + 8) {
          auVar31 = vcvtph2ps_f16c(*pauVar22);
          *pauVar27 = auVar31;
          pauVar22 = pauVar22 + 1;
          pauVar27 = pauVar27 + 1;
          lVar17 = lVar17 + 8;
        }
        for (; iVar18 + 3 < iVar10; iVar18 = iVar18 + 4) {
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)*pauVar22;
          auVar7 = vcvtph2ps_f16c(auVar7);
          *(undefined1 (*) [16])*pauVar27 = auVar7;
          pauVar22 = (undefined1 (*) [16])(*pauVar22 + 8);
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
          lVar17 = lVar17 + 4;
        }
        for (; (int)lVar17 < iVar10; lVar17 = lVar17 + 1) {
          fVar30 = float16_to_float32(*(unsigned_short *)
                                       ((long)pvVar12 + lVar17 * 2 + sVar4 * sVar20 * uVar16));
          *(float *)((long)pvVar15 + lVar17 * 4 + sVar6 * sVar5 * uVar16) = fVar30;
        }
      }
    }
    else {
      cast_fp16_to_fp32_sse_avx512fp16(bottom_blob,top_blob,opt);
    }
  }
  pp_Var3 = this->_vptr_Cast_x86_avx512;
  p_Var13 = pp_Var3[-3];
  iVar10 = *(int *)(&this->field_0xd0 + (long)p_Var13);
  if (iVar10 == 3) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var13) != 1) goto LAB_0048d3b4;
    uVar23 = iVar1 * _elempack * iVar24 * iVar11;
    pvVar12 = bottom_blob->data;
    sVar20 = bottom_blob->cstep;
    pvVar15 = top_blob->data;
    sVar4 = top_blob->cstep;
    sVar5 = top_blob->elemsize;
    uVar16 = 0;
    uVar14 = (ulong)uVar23;
    if ((int)uVar23 < 1) {
      uVar14 = uVar16;
    }
    uVar21 = (ulong)_c;
    if ((int)_c < 1) {
      uVar21 = uVar16;
    }
    sVar6 = bottom_blob->elemsize;
    for (; uVar16 != uVar21; uVar16 = uVar16 + 1) {
      for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
        *(float *)((long)pvVar15 + uVar19 * 4) = (float)(int)*(char *)((long)pvVar12 + uVar19);
      }
      pvVar15 = (void *)((long)pvVar15 + sVar4 * sVar5);
      pvVar12 = (void *)((long)pvVar12 + sVar20 * sVar6);
    }
    p_Var13 = pp_Var3[-3];
    iVar10 = *(int *)(&this->field_0xd0 + (long)p_Var13);
  }
  if ((iVar10 == 1) && (*(int *)(&this->field_0xd4 + (long)p_Var13) == 4)) {
    iVar11 = cpu_support_x86_avx512_bf16();
    if (iVar11 == 0) {
      iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar16 = 0;
      uVar14 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar14 = uVar16;
      }
      auVar31._16_16_ = _DAT_004cfba0;
      auVar31._0_16_ = _DAT_004cfba0;
      for (; uVar16 != uVar14; uVar16 = uVar16 + 1) {
        pvVar12 = bottom_blob->data;
        sVar20 = bottom_blob->elemsize;
        sVar4 = bottom_blob->cstep;
        pauVar26 = (undefined1 (*) [64])(sVar4 * uVar16 * sVar20 + (long)pvVar12);
        pvVar15 = top_blob->data;
        sVar5 = top_blob->elemsize;
        sVar6 = top_blob->cstep;
        pauVar27 = (undefined1 (*) [32])(sVar6 * uVar16 * sVar5 + (long)pvVar15);
        lVar17 = 0;
        for (iVar24 = 0; iVar24 + 0xf < iVar11; iVar24 = iVar24 + 0x10) {
          auVar29 = vpsrld_avx512f(*pauVar26,0x10);
          auVar28 = vpmovdw_avx512f(auVar29);
          *pauVar27 = auVar28;
          pauVar26 = pauVar26 + 1;
          pauVar27 = pauVar27 + 1;
          lVar17 = lVar17 + 0x10;
        }
        for (; iVar24 + 7 < iVar11; iVar24 = iVar24 + 8) {
          auVar28 = vpermw_avx512vl(auVar31,*(undefined1 (*) [32])*pauVar26);
          *(undefined1 (*) [16])*pauVar27 = auVar28._0_16_;
          pauVar26 = (undefined1 (*) [64])(*pauVar26 + 0x20);
          pauVar27 = (undefined1 (*) [32])((long)*pauVar27 + 0x10);
          lVar17 = lVar17 + 8;
        }
        for (; (int)lVar17 < iVar11; lVar17 = lVar17 + 1) {
          *(undefined2 *)((long)pvVar15 + lVar17 * 2 + sVar6 * sVar5 * uVar16) =
               *(undefined2 *)((long)pvVar12 + lVar17 * 4 + sVar4 * sVar20 * uVar16 + 2);
        }
      }
    }
    else {
      cast_fp32_to_bf16_sse_avx512bf16(bottom_blob,top_blob,opt);
    }
  }
LAB_0048d3b4:
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 4) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) {
    iVar11 = cpu_support_x86_avx512_bf16();
    if (iVar11 == 0) {
      iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar14 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar14 = 0;
      }
      for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
        pvVar12 = bottom_blob->data;
        sVar20 = bottom_blob->elemsize;
        sVar4 = bottom_blob->cstep;
        pauVar25 = (undefined1 (*) [16])(sVar4 * uVar16 * sVar20 + (long)pvVar12);
        pvVar15 = top_blob->data;
        sVar5 = top_blob->elemsize;
        sVar6 = top_blob->cstep;
        pauVar22 = (undefined1 (*) [16])(sVar6 * uVar16 * sVar5 + (long)pvVar15);
        lVar17 = 0;
        for (iVar24 = 0; iVar24 + 7 < iVar11; iVar24 = iVar24 + 8) {
          auVar7 = vlddqu_avx(*pauVar25);
          auVar8 = vpunpcklwd_avx((undefined1  [16])0x0,auVar7);
          auVar7 = vpunpckhwd_avx((undefined1  [16])0x0,auVar7);
          pauVar22[1] = auVar7;
          *pauVar22 = auVar8;
          pauVar25 = pauVar25 + 1;
          pauVar22 = pauVar22 + 2;
          lVar17 = lVar17 + 8;
        }
        for (; (int)lVar17 < iVar11; lVar17 = lVar17 + 1) {
          *(uint *)((long)pvVar15 + lVar17 * 4 + sVar6 * sVar5 * uVar16) =
               (uint)*(ushort *)((long)pvVar12 + lVar17 * 2 + sVar4 * sVar20 * uVar16) << 0x10;
        }
      }
    }
    else {
      cast_bf16_to_fp32_sse_avx512bf16(bottom_blob,top_blob,opt);
    }
  }
  return 0;
}

Assistant:

int Cast_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}